

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mxnet2ncnn.cpp
# Opt level: O2

vector<int,_std::allocator<int>_> * __thiscall
MXNetNode::attr_ai(vector<int,_std::allocator<int>_> *__return_storage_ptr__,MXNetNode *this,
                  char *key)

{
  int iVar1;
  const_iterator cVar2;
  long lVar3;
  long lVar4;
  int nconsumed;
  int i;
  int local_54;
  key_type local_50;
  
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_50,key,(allocator<char> *)&local_54);
  cVar2 = std::
          _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
          ::find(&(this->attrs)._M_t,&local_50);
  std::__cxx11::string::~string((string *)&local_50);
  (__return_storage_ptr__->super__Vector_base<int,_std::allocator<int>_>)._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  (__return_storage_ptr__->super__Vector_base<int,_std::allocator<int>_>)._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  (__return_storage_ptr__->super__Vector_base<int,_std::allocator<int>_>)._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  if ((_Rb_tree_header *)cVar2._M_node != &(this->attrs)._M_t._M_impl.super__Rb_tree_header) {
    local_54 = 0;
    lVar4 = *(long *)(cVar2._M_node + 2);
    lVar3 = 0;
    while( true ) {
      local_50._M_dataplus._M_p._0_4_ = 0;
      iVar1 = __isoc99_sscanf(lVar4,"%*[(,]%d%n",&local_50,&local_54);
      if (iVar1 != 1) break;
      std::vector<int,_std::allocator<int>_>::push_back
                (__return_storage_ptr__,(value_type_conflict1 *)&local_50);
      lVar3 = (long)(int)lVar3 + (long)local_54;
      lVar4 = lVar3 + *(long *)(cVar2._M_node + 2);
    }
  }
  return __return_storage_ptr__;
}

Assistant:

std::vector<int> MXNetNode::attr_ai(const char* key) const
{
    const std::map<std::string, std::string>::const_iterator it = attrs.find(key);
    if (it == attrs.end())
        return std::vector<int>();

    // (1,2,3)
    std::vector<int> list;

    int i = 0;
    int c = 0;
    int nconsumed = 0;
    int nscan = sscanf(it->second.c_str() + c, "%*[(,]%d%n", &i, &nconsumed);
    while (nscan == 1)
    {
        list.push_back(i);
//         fprintf(stderr, "%d\n", i);

        i = 0;
        c += nconsumed;
        nscan = sscanf(it->second.c_str() + c, "%*[(,]%d%n", &i, &nconsumed);
    }

    return list;
}